

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_drop.cpp
# Opt level: O2

unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true> __thiscall
duckdb::Transformer::TransformDropSecret(Transformer *this,PGDropSecretStmt *stmt)

{
  OnEntryNotFound OVar1;
  _Head_base<0UL,_duckdb::ExtraDropInfo_*,_false> _Var2;
  _Head_base<0UL,_duckdb::DropInfo_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ExtraDropSecretInfo_*,_false> _Var4;
  _Head_base<0UL,_duckdb::DropInfo_*,_false> _Var5;
  SecretPersistType SVar6;
  pointer pDVar7;
  pointer pEVar8;
  pointer pDVar9;
  ParserException *this_00;
  long in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ExtraDropSecretInfo_*,_false> local_78;
  _Head_base<0UL,_duckdb::DropInfo_*,_false> local_70;
  allocator local_61;
  string local_60;
  string local_40;
  
  make_uniq<duckdb::DropStatement>();
  make_uniq<duckdb::DropInfo>();
  make_uniq<duckdb::ExtraDropSecretInfo>();
  pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_70);
  (pDVar7->super_ParseInfo).field_0x9 = 0x47;
  pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_70);
  ::std::__cxx11::string::assign((char *)&pDVar7->name);
  OVar1 = *(OnEntryNotFound *)(in_RDX + 0x20);
  pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_70);
  pDVar7->if_not_found = OVar1;
  ::std::__cxx11::string::string((string *)&local_40,*(char **)(in_RDX + 8),&local_61);
  StringUtil::Upper(&local_60,&local_40);
  SVar6 = EnumUtil::FromString<duckdb::SecretPersistType>(local_60._M_dataplus._M_p);
  pEVar8 = unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
                         *)&local_78);
  (pEVar8->super_ExtraDropInfo).field_0x9 = SVar6;
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  pEVar8 = unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
                         *)&local_78);
  ::std::__cxx11::string::assign((char *)&pEVar8->secret_storage);
  pEVar8 = unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
                         *)&local_78);
  if ((pEVar8->super_ExtraDropInfo).field_0x9 == '\x01') {
    pEVar8 = unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
             ::operator->((unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
                           *)&local_78);
    if ((pEVar8->secret_storage)._M_string_length != 0) {
      this_00 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_60,
                 "Can not combine TEMPORARY with specifying a storage for drop secret",
                 (allocator *)&local_40);
      ParserException::ParserException(this_00,&local_60);
      __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  _Var4._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (ExtraDropSecretInfo *)0x0;
  pDVar7 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_70);
  _Var2._M_head_impl =
       (pDVar7->extra_drop_info).
       super_unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
       super___uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>.
       super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl;
  (pDVar7->extra_drop_info).
  super_unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>.
  super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl =
       &(_Var4._M_head_impl)->super_ExtraDropInfo;
  if (_Var2._M_head_impl != (ExtraDropInfo *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_ExtraDropInfo + 8))();
  }
  pDVar9 = unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>::
           operator->((unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>
                       *)this);
  _Var5._M_head_impl = local_70._M_head_impl;
  local_70._M_head_impl = (DropInfo *)0x0;
  _Var3._M_head_impl =
       (pDVar9->info).super_unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>.
       _M_t.super___uniq_ptr_impl<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::DropInfo_*,_std::default_delete<duckdb::DropInfo>_>.
       super__Head_base<0UL,_duckdb::DropInfo_*,_false>._M_head_impl;
  (pDVar9->info).super_unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DropInfo_*,_std::default_delete<duckdb::DropInfo>_>.
  super__Head_base<0UL,_duckdb::DropInfo_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var3._M_head_impl != (DropInfo *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ParseInfo + 8))();
  }
  if (local_78._M_head_impl != (ExtraDropSecretInfo *)0x0) {
    (*((local_78._M_head_impl)->super_ExtraDropInfo)._vptr_ExtraDropInfo[1])();
  }
  if (local_70._M_head_impl != (DropInfo *)0x0) {
    (*((local_70._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>_>)
         (unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>_>)this;
}

Assistant:

unique_ptr<DropStatement> Transformer::TransformDropSecret(duckdb_libpgquery::PGDropSecretStmt &stmt) {
	auto result = make_uniq<DropStatement>();
	auto info = make_uniq<DropInfo>();
	auto extra_info = make_uniq<ExtraDropSecretInfo>();

	info->type = CatalogType::SECRET_ENTRY;
	info->name = stmt.secret_name;
	info->if_not_found = stmt.missing_ok ? OnEntryNotFound::RETURN_NULL : OnEntryNotFound::THROW_EXCEPTION;

	extra_info->persist_mode = EnumUtil::FromString<SecretPersistType>(StringUtil::Upper(stmt.persist_type));
	extra_info->secret_storage = stmt.secret_storage;

	if (extra_info->persist_mode == SecretPersistType::TEMPORARY) {
		if (!extra_info->secret_storage.empty()) {
			throw ParserException("Can not combine TEMPORARY with specifying a storage for drop secret");
		}
	}

	info->extra_drop_info = std::move(extra_info);
	result->info = std::move(info);

	return result;
}